

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void LodePNGIText_cleanup(LodePNGInfo *info)

{
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  for (local_10 = 0; local_10 != *(long *)(in_RDI + 0x60); local_10 = local_10 + 1) {
    string_cleanup((char **)0x34790c);
    string_cleanup((char **)0x347926);
    string_cleanup((char **)0x347940);
    string_cleanup((char **)0x34795d);
  }
  lodepng_free((void *)0x34797e);
  lodepng_free((void *)0x34798c);
  lodepng_free((void *)0x34799a);
  lodepng_free((void *)0x3479ab);
  return;
}

Assistant:

static void LodePNGIText_cleanup(LodePNGInfo* info) {
  size_t i;
  for(i = 0; i != info->itext_num; ++i) {
    string_cleanup(&info->itext_keys[i]);
    string_cleanup(&info->itext_langtags[i]);
    string_cleanup(&info->itext_transkeys[i]);
    string_cleanup(&info->itext_strings[i]);
  }
  lodepng_free(info->itext_keys);
  lodepng_free(info->itext_langtags);
  lodepng_free(info->itext_transkeys);
  lodepng_free(info->itext_strings);
}